

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

int __thiscall
Js::ByteCodeBufferBuilder::GetString16Id
          (ByteCodeBufferBuilder *this,ByteBuffer *bb,bool isPropertyRecord)

{
  bool bVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar2;
  BufferBuilderRaw *this_00;
  ImmutableList<Js::BufferBuilder_*> *pIVar3;
  BufferBuilderRelativeOffset *pBVar4;
  BufferBuilder **ppBVar5;
  TrackAllocData local_e8;
  BufferBuilderRelativeOffset *local_c0;
  BufferBuilderRelativeOffset *stringIndexEntry;
  undefined8 local_b0;
  TrackAllocData local_a8;
  BufferBuilderRelativeOffset *local_80;
  BufferBuilderRelativeOffset *stringIndexEntry_1;
  undefined8 local_70;
  TrackAllocData local_68;
  BufferBuilderRaw *local_40;
  BufferBuilderRaw *stringEntry;
  undefined1 auStack_30 [4];
  uint32 sizeInBytes;
  IndexEntry indexEntry;
  ByteBuffer *pBStack_18;
  bool isPropertyRecord_local;
  ByteBuffer *bb_local;
  ByteCodeBufferBuilder *this_local;
  
  indexEntry._15_1_ = isPropertyRecord;
  pBStack_18 = bb;
  bb_local = (ByteBuffer *)this;
  bVar1 = JsUtil::
          BaseDictionary<Js::ByteBuffer*,Js::IndexEntry,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<Js::ByteBuffer*>
                    ((BaseDictionary<Js::ByteBuffer*,Js::IndexEntry,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->string16ToId,&stack0xffffffffffffffe8,(IndexEntry *)auStack_30);
  if (!bVar1) {
    stringEntry._4_4_ = pBStack_18->byteCount;
    pAVar2 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_68,(type_info *)&BufferBuilderRaw::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
               ,0x2ab);
    pAVar2 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar2,&local_68);
    stringIndexEntry_1 = (BufferBuilderRelativeOffset *)Memory::ArenaAllocator::Alloc;
    local_70 = 0;
    this_00 = (BufferBuilderRaw *)
              new<Memory::ArenaAllocator>(0x20,(ArenaAllocator *)pAVar2,0x3f67b0);
    BufferBuilderRaw::BufferBuilderRaw
              (this_00,L"String16",stringEntry._4_4_,(byte *)(pBStack_18->field_1).s8);
    local_40 = this_00;
    pIVar3 = regex::ImmutableList<Js::BufferBuilder_*>::Prepend
                       ((this->string16Table).list,(BufferBuilder *)this_00,this->alloc);
    (this->string16Table).list = pIVar3;
    if ((this->string16IndexTable).list == (ImmutableList<Js::BufferBuilder_*> *)0x0) {
      pAVar2 = &this->alloc->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_a8,(type_info *)&BufferBuilderRelativeOffset::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                 ,0x2b0);
      pAVar2 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar2,&local_a8);
      stringIndexEntry = (BufferBuilderRelativeOffset *)Memory::ArenaAllocator::Alloc;
      local_b0 = 0;
      pBVar4 = (BufferBuilderRelativeOffset *)
               new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar2,0x3f67b0);
      BufferBuilderRelativeOffset::BufferBuilderRelativeOffset
                (pBVar4,L"First String16 Index",&local_40->super_BufferBuilder);
      local_80 = pBVar4;
      pIVar3 = regex::ImmutableList<Js::BufferBuilder_*>::OfSingle
                         ((BufferBuilder *)pBVar4,this->alloc);
      (this->string16IndexTable).list = pIVar3;
      PrependByte(this,&this->string16IndexTable,L"isPropertyRecord",indexEntry._15_1_ & 1);
    }
    ppBVar5 = regex::ImmutableList<Js::BufferBuilder_*>::First((this->string16IndexTable).list);
    _auStack_30 = *ppBVar5;
    pAVar2 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_e8,(type_info *)&BufferBuilderRelativeOffset::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
               ,0x2b9);
    pAVar2 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar2,&local_e8);
    pBVar4 = (BufferBuilderRelativeOffset *)
             new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar2,0x3f67b0);
    BufferBuilderRelativeOffset::BufferBuilderRelativeOffset
              (pBVar4,L"String16 Index",&local_40->super_BufferBuilder,stringEntry._4_4_);
    local_c0 = pBVar4;
    pIVar3 = regex::ImmutableList<Js::BufferBuilder_*>::Prepend
                       ((this->string16IndexTable).list,(BufferBuilder *)pBVar4,this->alloc);
    (this->string16IndexTable).list = pIVar3;
    PrependByte(this,&this->string16IndexTable,L"isPropertyRecord",'\0');
    indexEntry.isPropertyRecord._0_4_ = this->nextString16Id;
    JsUtil::
    BaseDictionary<Js::ByteBuffer_*,_Js::IndexEntry,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Add(this->string16ToId,&stack0xffffffffffffffe8,(IndexEntry *)auStack_30);
    this->nextString16Id = this->nextString16Id + 1;
  }
  if ((indexEntry._15_1_ & 1) != 0) {
    _auStack_30->field_0x14 = indexEntry._15_1_ & 1;
  }
  return (int)indexEntry.isPropertyRecord;
}

Assistant:

int GetString16Id(ByteBuffer * bb, bool isPropertyRecord = false)
    {
        IndexEntry indexEntry;
        if (!string16ToId->TryGetValue(bb, &indexEntry))
        {
            auto sizeInBytes = bb->byteCount;
            auto stringEntry = Anew(alloc, BufferBuilderRaw, _u("String16"), sizeInBytes, (const byte *)bb->pv); // Writing the terminator even though it is computable so that this memory can be used as-is when deserialized
            string16Table.list = string16Table.list->Prepend(stringEntry, alloc);
            if (string16IndexTable.list == nullptr)
            {
                // First item in the list is the first string.
                auto stringIndexEntry = Anew(alloc, BufferBuilderRelativeOffset, _u("First String16 Index"), stringEntry);
                string16IndexTable.list = regex::ImmutableList<Js::BufferBuilder*>::OfSingle(stringIndexEntry, alloc);
                PrependByte(string16IndexTable, _u("isPropertyRecord"), (BYTE)isPropertyRecord);
            }

            // Get a pointer to the previous entry of isPropertyRecord
            indexEntry.isPropertyRecord = static_cast<BufferBuilderByte*>(string16IndexTable.list->First());

            // Subsequent strings indexes point one past the end. This way, the size is always computable by subtracting indexes.
            auto stringIndexEntry = Anew(alloc, BufferBuilderRelativeOffset, _u("String16 Index"), stringEntry, sizeInBytes);
            string16IndexTable.list = string16IndexTable.list->Prepend(stringIndexEntry, alloc);

            // By default, mark the next string to be not a property record.
            PrependByte(string16IndexTable, _u("isPropertyRecord"), (BYTE)false);

            indexEntry.id = nextString16Id;
            string16ToId->Add(bb, indexEntry);
            ++nextString16Id;
        }
        // A string might start off as not being a property record and later becoming one. Hence,
        // we set only if the transition is from false => true. Once it is a property record, it cannot go back.
        if(isPropertyRecord)
        {
            indexEntry.isPropertyRecord->value = isPropertyRecord;
        }
        return indexEntry.id;
    }